

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permissions.cpp
# Opt level: O2

string * fs_get_permissions_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_00;
  _Bool _Var1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  ulong uVar5;
  string_view fname;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  error_code ec;
  string_view path_local;
  path local_48;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"---------",(allocator<char> *)&local_48);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&path_local,auto_format);
  uVar2 = std::filesystem::status(&local_48,&ec);
  std::filesystem::__cxx11::path::~path(&local_48);
  if (ec._M_value == 0) {
    uVar5 = uVar2 >> 0x20;
    if (((uint)(uVar2 >> 0x28) & 1) != 0) {
      local_88->_M_local_buf[0] = 'r';
    }
    if ((char)(uVar2 >> 0x20) < '\0') {
      local_88->_M_local_buf[1] = 'w';
    }
    if ((uVar5 & 0x40) != 0) {
      local_88->_M_local_buf[2] = 'x';
    }
    _Var1 = fs_is_windows();
    if (!_Var1) {
      if ((uVar5 & 0x20) != 0) {
        local_88->_M_local_buf[3] = 'r';
      }
      if ((uVar5 & 0x10) != 0) {
        local_88->_M_local_buf[4] = 'w';
      }
      if ((uVar5 & 8) != 0) {
        local_88->_M_local_buf[5] = 'x';
      }
      if ((uVar5 & 4) != 0) {
        local_88->_M_local_buf[6] = 'r';
      }
      if ((uVar5 & 2) != 0) {
        local_88->_M_local_buf[7] = 'w';
      }
      if ((uVar5 & 1) != 0) {
        local_88->_M_local_buf[8] = 'x';
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar3 = &local_78;
    if (local_88 == paVar3) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_78._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_78._M_allocated_capacity;
    }
    psVar4 = &local_80;
    __return_storage_ptr__->_M_string_length = local_80;
    local_88 = paVar3;
  }
  else {
    path_00._M_str = path_local._M_str;
    path_00._M_len = path_local._M_len;
    fname._M_str = "fs_get_permissions";
    fname._M_len = 0x12;
    fs_print_error(path_00,fname,&ec);
    paVar3 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
    psVar4 = &__return_storage_ptr__->_M_string_length;
  }
  *psVar4 = 0;
  paVar3->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_get_permissions(std::string_view path)
{

  std::string r = "---------";

#ifdef HAVE_CXX_FILESYSTEM
  std::error_code ec;
  const auto s = std::filesystem::status(path, ec);
  if(ec)  FFS_UNLIKELY
  {
    fs_print_error(path, __func__, ec);
    return {};
  }

  const std::filesystem::perms p = s.permissions();

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms none = std::filesystem::perms::none;
  constexpr std::filesystem::perms owner_read = std::filesystem::perms::owner_read;
  constexpr std::filesystem::perms owner_write = std::filesystem::perms::owner_write;
  constexpr std::filesystem::perms owner_exec = std::filesystem::perms::owner_exec;
  constexpr std::filesystem::perms group_read = std::filesystem::perms::group_read;
  constexpr std::filesystem::perms group_write = std::filesystem::perms::group_write;
  constexpr std::filesystem::perms group_exec = std::filesystem::perms::group_exec;
  constexpr std::filesystem::perms others_read = std::filesystem::perms::others_read;
  constexpr std::filesystem::perms others_write = std::filesystem::perms::others_write;
  constexpr std::filesystem::perms others_exec = std::filesystem::perms::others_exec;
#endif

  if ((p & owner_read) != none)
    r[0] = 'r';
  if ((p & owner_write) != none)
    r[1] = 'w';
  if ((p & owner_exec) != none)
    r[2] = 'x';

  if(!fs_is_windows()){

  if ((p & group_read) != none)
    r[3] = 'r';
  if ((p & group_write) != none)
    r[4] = 'w';
  if ((p & group_exec) != none)
    r[5] = 'x';
  if ((p & others_read) != none)
    r[6] = 'r';
  if ((p & others_write) != none)
    r[7] = 'w';
  if ((p & others_exec) != none)
    r[8] = 'x';

  }

#else

  const int m = fs_st_mode(path);
  if(m == 0) FFS_UNLIKELY
  {
    fs_print_error(path, __func__);
    return {};
  }

#if defined(_MSC_VER)
  if (m & _S_IREAD)
    r[0] = 'r';
  if (m & _S_IWRITE)
    r[1] = 'w';
  if (m & _S_IEXEC)
    r[2] = 'x';
#else
  if (m & S_IRUSR)
    r[0] = 'r';
  if (m & S_IWUSR)
    r[1] = 'w';
  if (m & S_IXUSR)
    r[2] = 'x';
#endif

#if !defined(_WIN32)
  if (m & S_IRGRP)
    r[3] = 'r';
  if (m & S_IWGRP)
    r[4] = 'w';
  if (m & S_IXGRP)
    r[5] = 'x';
  if (m & S_IROTH)
    r[6] = 'r';
  if (m & S_IWOTH)
    r[7] = 'w';
  if (m & S_IXOTH)
    r[8] = 'x';
#endif

#endif

  return r;
}